

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

SubTypeIterator<glu::IsBasicType> * __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator++
          (SubTypeIterator<glu::IsBasicType> *__return_storage_ptr__,
          SubTypeIterator<glu::IsBasicType> *this,int param_1)

{
  int param_1_local;
  SubTypeIterator<glu::IsBasicType> *this_local;
  SubTypeIterator<glu::IsBasicType> *copy;
  
  SubTypeIterator(__return_storage_ptr__,this);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

SubTypeIterator<IsExpanded>			operator++			(int)	{ SubTypeIterator<IsExpanded> copy(*this); ++(*this); return copy; }